

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.c
# Opt level: O0

void quicly_sendbuf_dispose(quicly_sendbuf_t *sb)

{
  long *plVar1;
  long *in_RDI;
  quicly_sendbuf_vec_t *vec;
  size_t i;
  long local_10;
  
  for (local_10 = 0; local_10 != in_RDI[1]; local_10 = local_10 + 1) {
    plVar1 = (long *)(*in_RDI + local_10 * 0x18);
    if (*(long *)(*plVar1 + 8) != 0) {
      (**(code **)(*plVar1 + 8))(plVar1);
    }
  }
  free((void *)*in_RDI);
  return;
}

Assistant:

void quicly_sendbuf_dispose(quicly_sendbuf_t *sb)
{
    size_t i;

    for (i = 0; i != sb->vecs.size; ++i) {
        quicly_sendbuf_vec_t *vec = sb->vecs.entries + i;
        if (vec->cb->discard_vec != NULL)
            vec->cb->discard_vec(vec);
    }
    free(sb->vecs.entries);
}